

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O1

void __thiscall so_5::impl::disp_repository_t::send_shutdown_signal(disp_repository_t *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_named_dispatcher_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->m_named_dispatcher_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x18))();
  }
  return;
}

Assistant:

void
disp_repository_t::send_shutdown_signal()
{
	named_dispatcher_map_t::iterator it = m_named_dispatcher_map.begin();
	named_dispatcher_map_t::iterator it_end = m_named_dispatcher_map.end();

	for( ; it != it_end; ++it )
	{
		it->second->shutdown();
	}
}